

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O0

void Color::print_error(string *out)

{
  ostream *poVar1;
  string *in_RDI;
  Modifier reset;
  Modifier bold;
  Modifier red;
  Modifier *in_stack_ffffffffffffffe8;
  ostream *in_stack_fffffffffffffff0;
  
  Modifier::Modifier((Modifier *)&stack0xfffffffffffffff4,FG_RED);
  Modifier::Modifier((Modifier *)&stack0xfffffffffffffff0,BOLD);
  Modifier::Modifier((Modifier *)&stack0xffffffffffffffec,RESET);
  operator<<(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  poVar1 = operator<<(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  poVar1 = std::operator<<(poVar1,"[ ERROR      ] ");
  std::operator<<(poVar1,in_RDI);
  poVar1 = operator<<(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void print_error(const std::string &out) {
  Color::Modifier red(Color::FG_RED);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << red << bold << "[ ERROR      ] "
            << out << reset << std::endl;
}